

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O1

void traverse_ext_json(string *curr_json,size_t curr_node,ExtIsoForest *model,
                      vector<IsoHPlane,_std::allocator<IsoHPlane>_> *nodes,
                      size_t *terminal_node_mappings,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *numeric_colnames,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *categ_colnames,
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  size_t *terminal_node_mappings_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *numeric_colnames_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *nodes_00;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  runtime_error *this;
  size_type *psVar8;
  ulong uVar9;
  ulong *puVar10;
  pointer pIVar11;
  char cVar12;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string __str_1;
  long local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_t *local_98;
  long local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (interrupt_switch) {
    return;
  }
  pIVar11 = (nodes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
            super__Vector_impl_data._M_start + curr_node;
  local_88 = numeric_colnames;
  local_80 = nodes;
  if (curr_node != 0) {
    std::__cxx11::string::append((char *)curr_json);
  }
  uVar18 = (ulong)index1;
  uVar17 = uVar18 + curr_node;
  cVar12 = '\x01';
  if (9 < uVar17) {
    uVar9 = uVar17;
    cVar5 = '\x04';
    do {
      cVar12 = cVar5;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0035a865;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0035a865;
      }
      if (uVar9 < 10000) goto LAB_0035a865;
      bVar4 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0035a865:
  paVar14 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar14;
  local_98 = terminal_node_mappings;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar17);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x370e02);
  paVar15 = &local_178.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_178.field_2._M_allocated_capacity = *psVar8;
    local_178.field_2._8_8_ = plVar6[3];
    local_178._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_178.field_2._M_allocated_capacity = *psVar8;
    local_178._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_178._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198.field_2._8_8_ = plVar6[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_198._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar15) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar14) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (pIVar11->hplane_left == 0) {
    if ((model->scoring_metric == Density) || (model->scoring_metric == BoxedRatio)) {
      uVar19 = SUB84(pIVar11->score,0);
    }
    else {
      uVar19 = SUB84(pIVar11->score,0);
    }
    uVar17 = local_98[curr_node];
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_118,vsnprintf,0x148,"%f",uVar19);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x370cf4);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138.field_2._8_8_ = plVar6[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar8;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      __str.field_2._M_allocated_capacity = *psVar8;
      __str.field_2._8_8_ = plVar6[3];
      __str._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      __str.field_2._M_allocated_capacity = *psVar8;
      __str._M_dataplus._M_p = (pointer)*plVar6;
    }
    __str._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar12 = '\x01';
    if (9 < uVar17) {
      uVar18 = uVar17;
      cVar5 = '\x04';
      do {
        cVar12 = cVar5;
        if (uVar18 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_0035bf16;
        }
        if (uVar18 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_0035bf16;
        }
        if (uVar18 < 10000) goto LAB_0035bf16;
        bVar4 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar5 = cVar12 + '\x04';
      } while (bVar4);
      cVar12 = cVar12 + '\x01';
    }
LAB_0035bf16:
    paVar15 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct((ulong)&__str_1,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar17);
    uVar17 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             __str._M_string_length;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar14) {
      uVar13 = __str.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar17) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar15) {
        uVar13 = __str_1.field_2._M_allocated_capacity;
      }
      if (uVar17 <= (ulong)uVar13) {
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&__str_1,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
        goto LAB_0035bfb6;
      }
    }
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&__str,(ulong)__str_1._M_dataplus._M_p);
LAB_0035bfb6:
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178.field_2._8_8_ = puVar7[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_178._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_198.field_2._M_allocated_capacity = *psVar8;
      local_198.field_2._8_8_ = plVar6[3];
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar8;
      local_198._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_198._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar15) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar14) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      return;
    }
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    return;
  }
  uVar17 = pIVar11->hplane_left + uVar18;
  cVar12 = '\x01';
  if (9 < uVar17) {
    uVar9 = uVar17;
    cVar5 = '\x04';
    do {
      cVar12 = cVar5;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0035aba0;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0035aba0;
      }
      if (uVar9 < 10000) goto LAB_0035aba0;
      bVar4 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0035aba0:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_118,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_118._M_dataplus._M_p,(uint)local_118._M_string_length,uVar17);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x370d0d);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_138.field_2._M_allocated_capacity = *puVar10;
    local_138.field_2._8_8_ = plVar6[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar10;
    local_138._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    __str.field_2._M_allocated_capacity = *psVar8;
    __str.field_2._8_8_ = plVar6[3];
    __str._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    __str.field_2._M_allocated_capacity = *psVar8;
    __str._M_dataplus._M_p = (pointer)*plVar6;
  }
  __str._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar18 = pIVar11->hplane_right + uVar18;
  cVar12 = '\x01';
  if (9 < uVar18) {
    uVar17 = uVar18;
    cVar5 = '\x04';
    do {
      cVar12 = cVar5;
      if (uVar17 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0035acee;
      }
      if (uVar17 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0035acee;
      }
      if (uVar17 < 10000) goto LAB_0035acee;
      bVar4 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar5 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0035acee:
  __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar18);
  uVar17 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
           __str._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar14) {
    uVar13 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar17) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      uVar13 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar17) goto LAB_0035ad75;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&__str_1,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
  }
  else {
LAB_0035ad75:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&__str,(ulong)__str_1._M_dataplus._M_p);
  }
  puVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_178.field_2._M_allocated_capacity = *puVar10;
    local_178.field_2._8_8_ = puVar7[3];
    local_178._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar10;
    local_178._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_178._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198.field_2._8_8_ = puVar7[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_198._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar15) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar14) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (*(pointer *)
       ((long)&(pIVar11->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl + 8) !=
      *(pointer *)
       &(pIVar11->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
     ) {
    uVar17 = 0;
    local_c0 = 0;
    local_90 = 0;
    local_78 = curr_json;
    do {
      paVar15 = &__str.field_2;
      paVar14 = &local_178.field_2;
      if (uVar17 != 0) {
        std::__cxx11::string::append((char *)curr_json);
      }
      std::__cxx11::string::append((char *)curr_json);
      iVar2 = *(int *)(*(long *)&(pIVar11->col_type).
                                 super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                 super__Vector_impl_data + uVar17 * 4);
      if (iVar2 == 0x20) {
        std::operator+(&local_178,"\"column\":\"",
                       (categ_colnames->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       *(long *)(*(long *)&(pIVar11->col_num).
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl + uVar17 * 8));
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_198.field_2._M_allocated_capacity = *psVar8;
          local_198.field_2._8_8_ = puVar7[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar8;
          local_198._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_198._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar14) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (model->cat_split_type == SubSet) {
          std::__cxx11::string::append((char *)curr_json);
          lVar16 = *(long *)&(pIVar11->cat_coef).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar16 + 8 + local_c0 * 0x18) != *(long *)(lVar16 + local_c0 * 0x18)) {
            lVar16 = 0;
            uVar18 = 0;
            do {
              if (uVar18 != 0) {
                std::__cxx11::string::append((char *)curr_json);
              }
              std::operator+(&__str,"\"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)&(categ_levels->
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [*(long *)(*(long *)&(pIVar11->col_num).
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + uVar17 * 8)].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar16));
              puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&__str);
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              puVar10 = puVar7 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_178.field_2._M_allocated_capacity = *puVar10;
                local_178.field_2._8_8_ = puVar7[3];
              }
              else {
                local_178.field_2._M_allocated_capacity = *puVar10;
                local_178._M_dataplus._M_p = (pointer)*puVar7;
              }
              local_178._M_string_length = puVar7[1];
              *puVar7 = puVar10;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        (&local_138,vsnprintf,0x148,"%f",
                         (int)*(undefined8 *)
                               (*(long *)(*(long *)&(pIVar11->cat_coef).
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + local_c0 * 0x18
                                         ) + uVar18 * 8));
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                uVar13 = local_178.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_138._M_string_length + local_178._M_string_length) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  uVar13 = local_138.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_138._M_string_length + local_178._M_string_length)
                goto LAB_0035b348;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_138,0,(char *)0x0,
                                    (ulong)local_178._M_dataplus._M_p);
              }
              else {
LAB_0035b348:
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_178,(ulong)local_138._M_dataplus._M_p);
              }
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              psVar8 = puVar7 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_198.field_2._M_allocated_capacity = *psVar8;
                local_198.field_2._8_8_ = puVar7[3];
              }
              else {
                local_198.field_2._M_allocated_capacity = *psVar8;
                local_198._M_dataplus._M_p = (pointer)*puVar7;
              }
              local_198._M_string_length = puVar7[1];
              *puVar7 = psVar8;
              puVar7[1] = 0;
              *(undefined1 *)psVar8 = 0;
              std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              lVar3 = *(long *)&(pIVar11->cat_coef).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              uVar18 = uVar18 + 1;
              lVar16 = lVar16 + 0x20;
            } while (uVar18 < (ulong)(*(long *)(lVar3 + 8 + local_c0 * 0x18) -
                                      *(long *)(lVar3 + local_c0 * 0x18) >> 3));
          }
          std::__cxx11::string::append((char *)curr_json);
        }
        else if (model->cat_split_type == SingleCateg) {
          std::operator+(&local_138,"\"category\":\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)*(int *)(*(long *)&(pIVar11->chosen_cat).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data + local_c0 * 4) *
                          0x20 + *(long *)&(categ_levels->
                                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [*(long *)(*(long *)&(pIVar11->col_num).
                                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + uVar17 * 8)].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar8) {
            __str.field_2._M_allocated_capacity = *psVar8;
            __str.field_2._8_8_ = plVar6[3];
            __str._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar8;
            __str._M_dataplus._M_p = (pointer)*plVar6;
          }
          __str._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_118,vsnprintf,0x148,"%f",
                     (int)*(undefined8 *)
                           (*(long *)&(pIVar11->fill_new).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + local_c0 * 8));
          curr_json = local_78;
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar15) {
            uVar13 = __str.field_2._M_allocated_capacity;
          }
          uVar18 = CONCAT44(local_118._M_string_length._4_4_,(uint)local_118._M_string_length) +
                   __str._M_string_length;
          if ((ulong)uVar13 < uVar18) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar13 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < uVar18) goto LAB_0035b8a2;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
          }
          else {
LAB_0035b8a2:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&__str,(ulong)local_118._M_dataplus._M_p);
          }
          puVar10 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_178.field_2._M_allocated_capacity = *puVar10;
            local_178.field_2._8_8_ = puVar7[3];
            local_178._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_178.field_2._M_allocated_capacity = *puVar10;
            local_178._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_178._M_string_length = puVar7[1];
          *puVar7 = puVar10;
          puVar7[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198.field_2._8_8_ = puVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_198._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar14) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar15) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
        }
        if (model->missing_action != Fail) {
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_178,vsnprintf,0x148,"%f",
                     (int)*(undefined8 *)
                           (*(long *)&(pIVar11->fill_val).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + uVar17 * 8));
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x370e85);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198.field_2._8_8_ = puVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_198._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        local_c0 = local_c0 + 1;
      }
      else {
        if (iVar2 != 0x1f) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"Unexpected error in ","");
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__str_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/formatted_exporters.cpp"
                     ,"");
          std::operator+(&local_138,&local_118,&__str_1);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,":","");
          std::operator+(&__str,&local_138,&local_b8);
          std::__cxx11::to_string(&local_50,0x497);
          std::operator+(&local_178,&__str,&local_50);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,
                     ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                     ,"");
          std::operator+(&local_198,&local_178,&local_70);
          std::runtime_error::runtime_error(this,(string *)&local_198);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::operator+(&local_118,"\"column\":\"",
                       (local_88->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       *(long *)(*(long *)&(pIVar11->col_num).
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl + uVar17 * 8));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        paVar1 = &local_138.field_2;
        puVar10 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_138.field_2._M_allocated_capacity = *puVar10;
          local_138.field_2._8_8_ = plVar6[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *puVar10;
          local_138._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_138._M_string_length = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&__str_1,vsnprintf,0x148,"%f",
                   (int)*(undefined8 *)
                         (*(long *)&(pIVar11->coef).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + local_90 * 8));
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          uVar13 = local_138.field_2._M_allocated_capacity;
        }
        uVar18 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
                 local_138._M_string_length;
        if ((ulong)uVar13 < uVar18) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
            uVar13 = __str_1.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < uVar18) goto LAB_0035b1db;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&__str_1,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
        }
        else {
LAB_0035b1db:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)__str_1._M_dataplus._M_p);
        }
        psVar8 = puVar7 + 2;
        if ((size_type *)*puVar7 == psVar8) {
          __str.field_2._M_allocated_capacity = *psVar8;
          __str.field_2._8_8_ = puVar7[3];
          __str._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          __str.field_2._M_allocated_capacity = *psVar8;
          __str._M_dataplus._M_p = (pointer)*puVar7;
        }
        __str._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(char *)psVar8 = '\0';
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&__str);
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_178.field_2._M_allocated_capacity = *puVar10;
          local_178.field_2._8_8_ = puVar7[3];
          local_178._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_178.field_2._M_allocated_capacity = *puVar10;
          local_178._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_178._M_string_length = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_b8,vsnprintf,0x148,"%f",
                   (int)*(undefined8 *)
                         (*(long *)&(pIVar11->mean).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + local_90 * 8));
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar14) {
          uVar13 = local_178.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_b8._M_string_length + local_178._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar13 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_b8._M_string_length + local_178._M_string_length)
          goto LAB_0035b5a4;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b8,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
        }
        else {
LAB_0035b5a4:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_178,(ulong)local_b8._M_dataplus._M_p);
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_198.field_2._M_allocated_capacity = *psVar8;
          local_198.field_2._8_8_ = puVar7[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar8;
          local_198._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_198._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)psVar8 = 0;
        std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar14) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar15) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (model->missing_action != Fail) {
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_178,vsnprintf,0x148,"%f",
                     (int)*(undefined8 *)
                           (*(long *)&(pIVar11->fill_val).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + uVar17 * 8));
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x370e85);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198.field_2._8_8_ = puVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar8;
            local_198._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_198._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar14) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        local_90 = local_90 + 1;
      }
      std::__cxx11::string::append((char *)curr_json);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)*(pointer *)
                                     ((long)&(pIVar11->col_num).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl + 8) -
                              *(long *)&(pIVar11->col_num).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl >> 3));
  }
  paVar15 = &local_178.field_2;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_178,vsnprintf,0x148,"%f",SUB84(pIVar11->split_point,0));
  puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x370f1a);
  paVar14 = &local_198.field_2;
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198.field_2._8_8_ = puVar7[3];
    local_198._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_198._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar14) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar15) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (model->has_range_penalty != true) goto LAB_0035be3d;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_138,vsnprintf,0x148,"%f",SUB84(pIVar11->range_low,0));
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x370da9);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    __str.field_2._M_allocated_capacity = *psVar8;
    __str.field_2._8_8_ = plVar6[3];
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
  }
  else {
    __str.field_2._M_allocated_capacity = *psVar8;
    __str._M_dataplus._M_p = (pointer)*plVar6;
  }
  __str._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&__str);
  puVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_178.field_2._M_allocated_capacity = *puVar10;
    local_178.field_2._8_8_ = puVar7[3];
    local_178._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar10;
    local_178._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_178._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_118,vsnprintf,0x148,"%f",SUB84(pIVar11->range_high,0));
  uVar17 = CONCAT44(local_118._M_string_length._4_4_,(uint)local_118._M_string_length) +
           local_178._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar15) {
    uVar13 = local_178.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar17) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar13 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar17) goto LAB_0035bd45;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_118,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
  }
  else {
LAB_0035bd45:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_118._M_dataplus._M_p);
  }
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198.field_2._8_8_ = puVar7[3];
    local_198._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_198._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::__cxx11::string::_M_append((char *)curr_json,(ulong)local_198._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar14) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar15) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
LAB_0035be3d:
  std::__cxx11::string::append((char *)curr_json);
  nodes_00 = local_80;
  numeric_colnames_00 = local_88;
  terminal_node_mappings_00 = local_98;
  traverse_ext_json(curr_json,pIVar11->hplane_left,model,local_80,local_98,local_88,categ_colnames,
                    categ_levels,output_tree_num,index1,tree_num);
  traverse_ext_json(curr_json,pIVar11->hplane_right,model,nodes_00,terminal_node_mappings_00,
                    numeric_colnames_00,categ_colnames,categ_levels,output_tree_num,index1,tree_num)
  ;
  return;
}

Assistant:

void traverse_ext_json
(
    std::string &curr_json, size_t curr_node,
    const ExtIsoForest &model, const std::vector<IsoHPlane> &nodes,
    const size_t *restrict terminal_node_mappings,
    const std::vector<std::string> &numeric_colnames,
    const std::vector<std::string> &categ_colnames,
    const std::vector<std::vector<std::string>> &categ_levels,
    bool output_tree_num, bool index1, size_t tree_num
)
{
    if (interrupt_switch) return;
    const IsoHPlane *hplane = &nodes[curr_node];
    if (curr_node > 0) curr_json.append(",");

    curr_json.append(
        "\"" +
        std::to_string(curr_node + (size_t)index1) +
        "\": {\"terminal\":\""
    );

    /* terminal node */
    if (hplane->hplane_left == 0)
    {
        const double score_write = (model.scoring_metric != Density && model.scoring_metric != BoxedRatio)?
                                    hplane->score : -hplane->score;
        const size_t terminal_idx = terminal_node_mappings[curr_node];
        curr_json.append(
            "yes\", \"score\":" +
            std::to_string(score_write) +
            ", \"leaf\":" +
            std::to_string(terminal_idx) +
            "}"
        );
        return;
    }

    curr_json.append(
        "no\", \"node_when_condition_is_met\":" +
        std::to_string(hplane->hplane_left + (size_t)index1) +
        ", \"node_when_condition_is_not_met\":" +
        std::to_string(hplane->hplane_right + (size_t)index1) +
        ", \"combination\":["
    );

    size_t n_visited_numeric = 0;
    size_t n_visited_categ = 0;
    for (size_t ix = 0; ix < hplane->col_num.size(); ix++)
    {
        if (ix > 0) curr_json.append(", ");
        curr_json.append("{");
        switch (hplane->col_type[ix])
        {
            case Numeric:
            {
                curr_json.append(
                    "\"column\":\"" +
                    numeric_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"numeric\", \"coefficient\":" +
                    std::to_string(hplane->coef[n_visited_numeric]) +
                    ", \"centering\":" +
                    std::to_string(hplane->mean[n_visited_numeric])
                );
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_numeric++;
                break;
            }

            case Categorical:
            {
                curr_json.append(
                    "\"column\":\"" +
                    categ_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"categorical\", "
                );
                switch (model.cat_split_type)
                {
                    case SingleCateg:
                    {
                        curr_json.append(
                            "\"category\":\"" +
                            categ_levels[hplane->col_num[ix]][hplane->chosen_cat[n_visited_categ]] +
                            "\", \"coefficient_category\":" +
                            std::to_string(hplane->fill_new[n_visited_categ]) +
                            ", \"coefficient_other_categories\":0.0"
                        );
                        break;
                    }

                    case SubSet:
                    {
                        curr_json.append(
                            "\"coefficients\":{"
                        );
                        for (size_t categ = 0; categ < hplane->cat_coef[n_visited_categ].size(); categ++)
                        {
                            if (categ > 0) curr_json.append(", ");
                            curr_json.append(
                                "\"" +
                                categ_levels[hplane->col_num[ix]][categ] +
                                "\":" +
                                std::to_string(hplane->cat_coef[n_visited_categ][categ])
                            );
                        }
                        curr_json.append("}");
                        break;
                    }
                }
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_categ++;
                break;
            }

            default:
            {
                unexpected_error();
                break;
            }
        }
        curr_json.append("}");
    }

    curr_json.append(
        "], \"condition\":\"<=\", \"value\":" +
        std::to_string(hplane->split_point)
    );

    if (model.has_range_penalty)
    {
        curr_json.append(
            ", \"range_low\":" +
            std::to_string(hplane->range_low) +
            ", \"range_high\":" +
            std::to_string(hplane->range_high)
        );
    }

    curr_json.append("}");

    traverse_ext_json(
        curr_json,
        hplane->hplane_left,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );

    traverse_ext_json(
        curr_json,
        hplane->hplane_right,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );
}